

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeparser.cpp
# Opt level: O0

void parseJuncData(Junction *junc,Network *nw,
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *tokenList)

{
  bool bVar1;
  size_type sVar2;
  InputError *pIVar3;
  Pattern *pPVar4;
  string local_d8 [39];
  undefined1 local_b1;
  string local_b0 [39];
  undefined1 local_89;
  string local_88 [32];
  reference local_68;
  string *tokens;
  allocator local_49;
  string local_48 [36];
  int local_24;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  int nTokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Network *nw_local;
  Junction *junc_local;
  
  pvStack_20 = tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)nw;
  nw_local = (Network *)junc;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  local_24 = (int)sVar2;
  if (local_24 < 2) {
    tokens._3_1_ = 1;
    pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"",&local_49);
    InputError::InputError(pIVar3,2,(string *)local_48);
    tokens._3_1_ = 0;
    __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
  }
  local_68 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](pvStack_20,0);
  bVar1 = Utilities::parseNumber<double>(local_68 + 0x20,(double *)&nw_local->title);
  if (bVar1) {
    if ((2 < local_24) &&
       (bVar1 = Utilities::parseNumber<double>(local_68 + 0x40,(double *)&nw_local->patterns),
       !bVar1)) {
      local_b1 = 1;
      pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string(local_b0,(string *)(local_68 + 0x40));
      InputError::InputError(pIVar3,6,(string *)local_b0);
      local_b1 = 0;
      __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
    }
    if ((3 < local_24) && (bVar1 = std::operator!=(local_68 + 0x60,"*"), bVar1)) {
      pPVar4 = Network::pattern((Network *)tokenList_local,local_68 + 0x60);
      (nw_local->patterns).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)pPVar4;
      if ((nw_local->patterns).super__Vector_base<Pattern_*,_std::allocator<Pattern_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage == (pointer)0x0) {
        pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string(local_d8,(string *)(local_68 + 0x60));
        InputError::InputError(pIVar3,5,(string *)local_d8);
        __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
      }
    }
    return;
  }
  local_89 = 1;
  pIVar3 = (InputError *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string(local_88,(string *)(local_68 + 0x20));
  InputError::InputError(pIVar3,6,(string *)local_88);
  local_89 = 0;
  __cxa_throw(pIVar3,&InputError::typeinfo,InputError::~InputError);
}

Assistant:

void parseJuncData(Junction* junc, Network* nw, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - junction ID
    // 1 - elevation
    // 2 - primary base demand (optional)
    // 3 - ID of primary demand pattern (optional)

    // ... check for enough tokens

    int nTokens = tokenList.size();
    if (nTokens < 2) throw InputError(InputError::TOO_FEW_ITEMS, "");
    string* tokens = &tokenList[0];

    // ... read elevation

    if (!Utilities::parseNumber(tokens[1], junc->elev))
    {
	    throw InputError(InputError::INVALID_NUMBER, tokens[1]);
    }

    // ... read optional base demand

    if (nTokens > 2)
	if (!Utilities::parseNumber(tokens[2], junc->primaryDemand.baseDemand))
	{
        throw InputError(InputError::INVALID_NUMBER, tokens[2]);
	}

    // ... read optional demand pattern

    if (nTokens > 3 && tokens[3] != "*")
    {
        junc->primaryDemand.timePattern = nw->pattern(tokens[3]);
        if ( !junc->primaryDemand.timePattern )
        {
            throw InputError(InputError::UNDEFINED_OBJECT, tokens[3]);
        }
    }
}